

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::storeObject
               (NameIdPool<xercesc_4_0::DTDElementDecl> *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  DTDElementDecl *pDVar2;
  ulong uVar3;
  NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> e;
  NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> local_38;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    local_38.fMemoryManager = objToStore->fMemoryManager;
    local_38.super_XMLEnumerator<xercesc_4_0::DTDElementDecl>._vptr_XMLEnumerator =
         (_func_int **)&PTR__XMLEnumerator_00403000;
    uVar3 = (ulong)(objToStore->fIdCounter != 0);
    local_38.fCurIndex = uVar3;
    local_38.fToEnum = objToStore;
    XSerializeEngine::operator<<(serEng,(uint)objToStore->fIdCounter);
    while ((uVar3 != 0 && (uVar3 <= (local_38.fToEnum)->fIdCounter))) {
      pDVar2 = NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl>::nextElement(&local_38);
      (*(pDVar2->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[3])(pDVar2,serEng);
      uVar3 = local_38.fCurIndex;
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(NameIdPool<DTDElementDecl>* const objToStore
                                    , XSerializeEngine&                 serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        NameIdPoolEnumerator<DTDElementDecl> e(objToStore, objToStore->getMemoryManager());

        serEng<<(unsigned int)e.size();

        while (e.hasMoreElements())
        {
            DTDElementDecl& data = e.nextElement();
            data.serialize(serEng);
        }
    }

}